

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O0

void __thiscall
gulcalc::output_mean
          (gulcalc *this,OASIS_FLOAT tiv,prob_mean *pp,int bin_count,OASIS_FLOAT *gul_mean,
          OASIS_FLOAT *std_dev,OASIS_FLOAT *max_loss)

{
  float fVar1;
  float fVar2;
  const_reference pvVar3;
  double dVar4;
  float local_58;
  OASIS_FLOAT g2;
  probrec p;
  int bin_index;
  OASIS_FLOAT ctr_var;
  OASIS_FLOAT last_prob_to;
  OASIS_FLOAT *max_loss_local;
  OASIS_FLOAT *std_dev_local;
  OASIS_FLOAT *gul_mean_local;
  prob_mean *ppStack_20;
  int bin_count_local;
  prob_mean *pp_local;
  OASIS_FLOAT tiv_local;
  gulcalc *this_local;
  
  bin_index = 0;
  *gul_mean = 0.0;
  *std_dev = 0.0;
  p.bin_mean = 0.0;
  ppStack_20 = pp;
  for (p.prob_to = 0.0; (int)p.prob_to < bin_count; p.prob_to = (OASIS_FLOAT)((int)p.prob_to + 1)) {
    if (p.prob_to == 0.0) {
      local_58 = 0.0;
    }
    else {
      local_58 = (float)bin_index;
    }
    fVar1 = ppStack_20->prob_to;
    fVar2 = ppStack_20->bin_mean;
    bin_index = (int)ppStack_20->prob_to;
    *gul_mean = (fVar1 - local_58) * fVar2 * tiv + *gul_mean;
    p.bin_mean = (fVar1 - local_58) * fVar2 * fVar2 * tiv * tiv + p.bin_mean;
    ppStack_20 = ppStack_20 + 1;
  }
  *std_dev = p.bin_mean - *gul_mean * *gul_mean;
  if (*std_dev <= 0.0 && *std_dev != 0.0) {
    *std_dev = 0.0;
  }
  dVar4 = std::sqrt((double)(ulong)(uint)*std_dev);
  *std_dev = SUB84(dVar4,0);
  pvVar3 = std::vector<damagebindictionary,_std::allocator<damagebindictionary>_>::operator[]
                     (this->damagebindictionary_vec_,(long)(bin_count + -1));
  *max_loss = tiv * pvVar3->bin_to;
  return;
}

Assistant:

void gulcalc::output_mean(OASIS_FLOAT tiv, prob_mean *pp, int bin_count,
			  OASIS_FLOAT &gul_mean,  OASIS_FLOAT &std_dev,
			  OASIS_FLOAT &max_loss)
{
	OASIS_FLOAT last_prob_to = 0;
	gul_mean = 0;
	std_dev = 0;
	OASIS_FLOAT ctr_var = 0;

	for (int bin_index = 0; bin_index < bin_count; bin_index++)
	{
		probrec p;
		if (bin_index == 0) {
			p.prob_from = 0;
		} else {
			p.prob_from = last_prob_to;
		}
		p.prob_to = pp->prob_to;
		p.bin_mean = pp->bin_mean;
		last_prob_to = pp->prob_to;
		gul_mean = gul_mean + ((p.prob_to - p.prob_from) *p.bin_mean * tiv);
		ctr_var = ctr_var + ((p.prob_to - p.prob_from) *p.bin_mean*p.bin_mean * tiv * tiv);
		pp++;
	}
	OASIS_FLOAT g2 = gul_mean * gul_mean;
	std_dev = ctr_var - g2;
	if (std_dev < 0) std_dev  = 0;
	std_dev = sqrt(std_dev);

	max_loss = tiv * (*damagebindictionary_vec_)[bin_count - 1].bin_to;
}